

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O3

void fill_flow_field_borders(double *flow,int width,int height,int stride)

{
  size_t __n;
  double *pdVar1;
  long lVar2;
  ulong uVar3;
  double *row;
  ulong uVar4;
  long lVar5;
  double *row_1;
  
  if (0 < height) {
    uVar4 = (ulong)(uint)height;
    uVar3 = uVar4;
    pdVar1 = flow;
    do {
      pdVar1[-2] = *pdVar1;
      pdVar1[-1] = *pdVar1;
      pdVar1 = pdVar1 + stride;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
    if (0 < height) {
      pdVar1 = flow + width;
      do {
        *pdVar1 = pdVar1[-1];
        pdVar1[1] = pdVar1[-1];
        pdVar1 = pdVar1 + stride;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  lVar5 = (long)stride;
  __n = (long)width * 8 + 0x20;
  pdVar1 = flow + lVar5 * -2 + -2;
  lVar2 = 2;
  do {
    memcpy(pdVar1,flow + -2,__n);
    pdVar1 = pdVar1 + lVar5;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  pdVar1 = flow + lVar5 * height + -2;
  lVar2 = 2;
  do {
    memcpy(pdVar1,flow + (long)((height + -1) * stride) + -2,__n);
    pdVar1 = pdVar1 + lVar5;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return;
}

Assistant:

static void fill_flow_field_borders(double *flow, int width, int height,
                                    int stride) {
  // Calculate the bounds of the rectangle which was filled in by
  // compute_flow_field() before calling this function.
  // These indices are inclusive on both ends.
  const int left_index = FLOW_BORDER_INNER;
  const int right_index = (width - FLOW_BORDER_INNER - 1);
  const int top_index = FLOW_BORDER_INNER;
  const int bottom_index = (height - FLOW_BORDER_INNER - 1);

  // Left area
  for (int i = top_index; i <= bottom_index; i += 1) {
    double *row = flow + i * stride;
    const double left = row[left_index];
    for (int j = -FLOW_BORDER_OUTER; j < left_index; j++) {
      row[j] = left;
    }
  }

  // Right area
  for (int i = top_index; i <= bottom_index; i += 1) {
    double *row = flow + i * stride;
    const double right = row[right_index];
    for (int j = right_index + 1; j < width + FLOW_BORDER_OUTER; j++) {
      row[j] = right;
    }
  }

  // Top area
  const double *top_row = flow + top_index * stride - FLOW_BORDER_OUTER;
  for (int i = -FLOW_BORDER_OUTER; i < top_index; i++) {
    double *row = flow + i * stride - FLOW_BORDER_OUTER;
    size_t length = width + 2 * FLOW_BORDER_OUTER;
    memcpy(row, top_row, length * sizeof(*row));
  }

  // Bottom area
  const double *bottom_row = flow + bottom_index * stride - FLOW_BORDER_OUTER;
  for (int i = bottom_index + 1; i < height + FLOW_BORDER_OUTER; i++) {
    double *row = flow + i * stride - FLOW_BORDER_OUTER;
    size_t length = width + 2 * FLOW_BORDER_OUTER;
    memcpy(row, bottom_row, length * sizeof(*row));
  }
}